

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::Dump(Instr *this,IRDumpFlags flags)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int32 iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Opnd *pOVar9;
  undefined4 *puVar10;
  long lVar11;
  IntConstOpnd *pIVar12;
  Func *pFVar13;
  BranchInstr *this_00;
  LabelInstr *pLVar14;
  MultiBranchInstr *pMVar15;
  PragmaInstr *pPVar16;
  JITTimeFunctionBody *this_01;
  ParseableFunctionInfo *pPVar17;
  undefined4 extraout_var;
  RegOpnd *pRVar18;
  BVSparse<Memory::JitArenaAllocator> *pBVar19;
  char16 *pcVar20;
  char *pcVar21;
  char16_t *form;
  char16_t *local_158;
  bool local_131;
  bool local_125;
  bool local_11b;
  char local_119;
  uint local_114;
  wchar local_108 [4];
  char16 debugStringBuffer [42];
  BailOutInfo *bailOutInfo;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  bool first;
  ByteCodeUsesInstr *tempbcu;
  Opnd *src2;
  ParseableFunctionInfo *local_70;
  ParseableFunctionInfo *function;
  Opnd *src1;
  MultiBranchInstr *multiBranchInstr;
  bool labelPrinted;
  LabelInstr *targetInstr;
  BranchInstr *branchInstr;
  bool dumpMarkTempObject;
  bool dumpMarkTempNumber;
  uint uStack_30;
  bool dumpMarkTemp;
  int32 temp;
  int32 offset;
  bool dumpSrc2;
  bool usePlus;
  bool useLessThanOrEqual;
  Opnd *dst;
  anon_class_8_1_8991fb9c PrintOpCodeName;
  bool SkipByteCodeOffset;
  bool SimpleForm;
  bool AsmDumpMode;
  IRDumpFlags flags_local;
  Instr *this_local;
  
  PrintOpCodeName.this._3_1_ = (flags & IRDumpFlags_AsmDumpMode) != IRDumpFlags_None;
  PrintOpCodeName.this._2_1_ = (flags & IRDumpFlags_SimpleForm) != IRDumpFlags_None;
  PrintOpCodeName.this._1_1_ = (flags & IRDumpFlags_SkipByteCodeOffset) != IRDumpFlags_None;
  _offset = (Opnd *)0x0;
  dst = (Opnd *)this;
  PrintOpCodeName.this._4_4_ = flags;
  if ((this->m_opcode == BoundCheck) || (this->m_opcode == UnsignedBoundCheck)) {
    Dump::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&dst);
    pOVar9 = GetSrc1(this);
    if (pOVar9 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1183,"(GetSrc1())","GetSrc1()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pOVar9 = GetSrc1(this);
    bVar2 = Opnd::IsIntConstOpnd(pOVar9);
    if (bVar2) {
      pOVar9 = GetSrc1(this);
      pIVar12 = Opnd::AsIntConstOpnd(pOVar9);
      lVar11 = EncodableOpnd<long>::GetValue(&pIVar12->super_EncodableOpnd<long>);
      Output::Print(L"%d",lVar11);
    }
    else {
      pOVar9 = GetSrc1(this);
      Opnd::Dump(pOVar9,PrintOpCodeName.this._4_4_,this->m_func);
    }
    temp._3_1_ = 1;
    temp._2_1_ = 1;
    temp._1_1_ = 0;
    pOVar9 = GetDst(this);
    if (pOVar9 == (Opnd *)0x0) {
      local_114 = 0;
    }
    else {
      pOVar9 = GetDst(this);
      pIVar12 = Opnd::AsIntConstOpnd(pOVar9);
      local_114 = IntConstOpnd::AsInt32(pIVar12);
    }
    uStack_30 = local_114;
    pOVar9 = GetSrc2(this);
    if (pOVar9 != (Opnd *)0x0) {
      pOVar9 = GetSrc2(this);
      bVar2 = Opnd::IsIntConstOpnd(pOVar9);
      uVar8 = uStack_30;
      if (bVar2) {
        pOVar9 = GetSrc2(this);
        pIVar12 = Opnd::AsIntConstOpnd(pOVar9);
        iVar4 = IntConstOpnd::AsInt32(pIVar12);
        bVar2 = Int32Math::Add(uVar8,iVar4,(int32 *)((long)&branchInstr + 4));
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x1197,
                             "(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp))"
                             ,
                             "!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pOVar9 = GetSrc2(this);
        pIVar12 = Opnd::AsIntConstOpnd(pOVar9);
        iVar4 = IntConstOpnd::AsInt32(pIVar12);
        uStack_30 = iVar4 + uStack_30;
      }
      else {
        temp._1_1_ = 1;
        if (uStack_30 == 0xffffffff) {
          temp._3_1_ = 0;
          uStack_30 = 0;
        }
        else if (((int)uStack_30 < 0) && (uStack_30 != 0x80000000)) {
          temp._2_1_ = 0;
          uStack_30 = -uStack_30;
        }
      }
    }
    pcVar21 = "<<";
    if ((temp._3_1_ & 1) != 0) {
      pcVar21 = "<<=";
    }
    Output::Print(L" %S ",pcVar21 + 1);
    if ((temp._1_1_ & 1) != 0) {
      pOVar9 = GetSrc2(this);
      Opnd::Dump(pOVar9,PrintOpCodeName.this._4_4_,this->m_func);
    }
    if (uStack_30 != 0) {
      if ((temp._1_1_ & 1) != 0) {
        local_119 = '+';
        if ((temp._2_1_ & 1) == 0) {
          local_119 = '-';
        }
        Output::Print(L" %C ",(ulong)(uint)(int)local_119);
      }
      Output::Print(L"%d",(ulong)uStack_30);
    }
  }
  else {
    Output::SkipToColumn(4);
    _offset = GetDst(this);
    if (_offset != (Opnd *)0x0) {
      Opnd::Dump(_offset,PrintOpCodeName.this._4_4_,this->m_func);
      uVar5 = Func::GetSourceContextId(this->m_func);
      uVar6 = Func::GetLocalFunctionId(this->m_func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,MarkTempPhase,uVar5,uVar6);
      local_11b = true;
      if (!bVar2) {
        uVar5 = Func::GetSourceContextId(this->m_func);
        uVar6 = Func::GetLocalFunctionId(this->m_func);
        local_11b = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MarkTempPhase,uVar5,uVar6);
      }
      branchInstr._3_1_ = local_11b;
      local_125 = true;
      if (local_11b == false) {
        uVar5 = Func::GetSourceContextId(this->m_func);
        uVar6 = Func::GetLocalFunctionId(this->m_func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,MarkTempNumberPhase,uVar5,uVar6);
        local_125 = true;
        if (!bVar2) {
          uVar5 = Func::GetSourceContextId(this->m_func);
          uVar6 = Func::GetLocalFunctionId(this->m_func);
          local_125 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MarkTempNumberPhase,uVar5,uVar6)
          ;
        }
      }
      branchInstr._2_1_ = local_125;
      local_131 = true;
      if ((branchInstr._3_1_ & 1) == 0) {
        uVar5 = Func::GetSourceContextId(this->m_func);
        uVar6 = Func::GetLocalFunctionId(this->m_func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,MarkTempObjectPhase,uVar5,uVar6);
        local_131 = true;
        if (!bVar2) {
          uVar5 = Func::GetSourceContextId(this->m_func);
          uVar6 = Func::GetLocalFunctionId(this->m_func);
          local_131 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MarkTempObjectPhase,uVar5,uVar6)
          ;
        }
      }
      branchInstr._1_1_ = local_131;
      if ((((branchInstr._2_1_ & 1) != 0) &&
          (((*(ushort *)&this->field_0x36 >> 2 & 1) != 0 ||
           ((*(ushort *)&this->field_0x36 >> 1 & 1) != 0)))) ||
         ((local_131 != false && ((*(ushort *)&this->field_0x36 >> 3 & 1) != 0)))) {
        Output::Print(L"[");
        if (((branchInstr._2_1_ & 1) != 0) &&
           (((DAT_01ec73ca & 1) != 0 ||
            (bVar2 = OpCodeAttr::TempNumberProducing(this->m_opcode), bVar2)))) {
          if ((*(ushort *)&this->field_0x36 >> 2 & 1) == 0) {
            if ((*(ushort *)&this->field_0x36 >> 1 & 1) != 0) {
              Output::Print(L"#");
            }
          }
          else {
            if ((*(ushort *)&this->field_0x36 >> 1 & 1) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                                 ,0x11d6,"(this->dstIsTempNumber)","this->dstIsTempNumber");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            Output::Print(L"x");
          }
        }
        if (((branchInstr._1_1_ & 1) != 0) &&
           ((((DAT_01ec73ca & 1) != 0 ||
             (bVar2 = OpCodeAttr::TempObjectProducing(this->m_opcode), bVar2)) &&
            ((*(ushort *)&this->field_0x36 >> 3 & 1) != 0)))) {
          Output::Print(L"o");
        }
        Output::Print(L"tmp]");
      }
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar5 = Func::GetSourceContextId(pFVar13);
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar6 = Func::GetLocalFunctionId(pFVar13);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,TrackNegativeZeroPhase,uVar5,uVar6);
      if ((bVar2) && (bVar2 = ShouldCheckForNegativeZero(this), !bVar2)) {
        Output::Print(L"[-0]");
      }
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar5 = Func::GetSourceContextId(pFVar13);
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar6 = Func::GetLocalFunctionId(pFVar13);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,TypedArrayVirtualPhase,uVar5,uVar6);
      if ((bVar2) &&
         ((bVar2 = IsDstNotAlwaysConvertedToInt32(this), !bVar2 ||
          (bVar2 = IsDstNotAlwaysConvertedToNumber(this), !bVar2)))) {
        bVar2 = IsDstNotAlwaysConvertedToInt32(this);
        if (bVar2) {
          Output::Print(L"[->n]");
        }
        else {
          Output::Print(L"[->i]");
        }
      }
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar5 = Func::GetSourceContextId(pFVar13);
      pFVar13 = Func::GetTopFunc(this->m_func);
      uVar6 = Func::GetLocalFunctionId(pFVar13);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,TrackIntOverflowPhase,uVar5,uVar6);
      if ((bVar2) && (bVar2 = ShouldCheckFor32BitOverflow(this), !bVar2)) {
        bVar2 = ShouldCheckForNon32BitOverflow(this);
        if (bVar2) {
          Output::Print(L"[OF %d]",(ulong)this->ignoreOverflowBitCount);
        }
        else {
          Output::Print(L"[OF]");
        }
      }
      if (((byte)this->field_0x38 >> 5 & 1) == 0) {
        Output::SkipToColumn(0x14);
        Output::Print(L"=");
      }
      else {
        Output::SkipToColumn(0x13);
        Output::Print(L"<==");
      }
    }
    Dump::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&dst);
    bVar2 = IsBranchInstr(this);
    if (bVar2) {
      this_00 = AsBranchInstr(this);
      pLVar14 = BranchInstr::GetTarget(this_00);
      bVar2 = true;
      if (pLVar14 == (LabelInstr *)0x0) {
        if (((this_00->m_isMultiBranch & 1U) == 0) ||
           (bVar3 = BranchInstr::IsMultiBranch(this_00), !bVar3)) {
          Output::Print(L"??");
        }
        else {
          pMVar15 = BranchInstr::AsMultiBrInstr(this_00);
          bVar2 = this->m_opcode == MultiBr;
          if (bVar2) {
            MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(pMVar15);
          }
        }
      }
      else {
        Output::Print(L"$L%d",(ulong)pLVar14->m_id);
      }
      pOVar9 = GetSrc1(this);
      if ((pOVar9 != (Opnd *)0x0) && (bVar2)) {
        Output::Print(L", ");
      }
    }
    else {
      bVar2 = IsPragmaInstr(this);
      if ((bVar2) && (this->m_opcode == StatementBoundary)) {
        pPVar16 = AsPragmaInstr(this);
        Output::Print(L"#%d",(ulong)pPVar16->m_statementIndex);
      }
    }
    pOVar9 = GetSrc1(this);
    if ((this->m_opcode == NewScFunc) || (this->m_opcode == NewScGenFunc)) {
      bVar2 = Opnd::IsIntConstOpnd(pOVar9);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x1245,"(src1->IsIntConstOpnd())","src1->IsIntConstOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      local_70 = (ParseableFunctionInfo *)0x0;
      bVar2 = Func::IsOOPJIT(this->m_func);
      if (!bVar2) {
        this_01 = Func::GetJITFunctionBody(this->m_func);
        pPVar17 = (ParseableFunctionInfo *)JITTimeFunctionBody::GetAddr(this_01);
        pIVar12 = Opnd::AsIntConstOpnd(pOVar9);
        lVar11 = EncodableOpnd<long>::GetValue(&pIVar12->super_EncodableOpnd<long>);
        pPVar17 = Js::ParseableFunctionInfo::GetNestedFunctionForExecution(pPVar17,(uint)lVar11);
        local_70 = Js::FunctionProxy::GetParseableFunctionInfo(&pPVar17->super_FunctionProxy);
      }
      if (local_70 == (ParseableFunctionInfo *)0x0) {
        local_158 = L"???";
      }
      else {
        iVar7 = (*(local_70->super_FunctionProxy).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        local_158 = (char16_t *)CONCAT44(extraout_var,iVar7);
      }
      Output::Print(L"func:%s()",local_158);
      Output::Print(L", env:");
      pOVar9 = GetSrc2(this);
      pRVar18 = Opnd::AsRegOpnd(pOVar9);
      Sym::Dump(&pRVar18->m_sym->super_Sym,PrintOpCodeName.this._4_4_,ValueType::Uninitialized);
    }
    else if (pOVar9 != (Opnd *)0x0) {
      Opnd::Dump(pOVar9,PrintOpCodeName.this._4_4_,this->m_func);
      pOVar9 = GetSrc2(this);
      if (pOVar9 != (Opnd *)0x0) {
        Output::Print(L", ");
        Opnd::Dump(pOVar9,PrintOpCodeName.this._4_4_,this->m_func);
      }
    }
    bVar2 = IsByteCodeUsesInstr(this);
    if ((bVar2) || (this->m_opcode == SpeculatedLoadFence)) {
      pBVar19 = ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed((ByteCodeUsesInstr *)this);
      if (pBVar19 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        bVar2 = true;
        pBVar19 = ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed((ByteCodeUsesInstr *)this);
        for (__startIndex = pBVar19->head; __startIndex != (Type_conflict)0x0;
            __startIndex = __startIndex->next) {
          _unit.word._0_4_ = __startIndex->startIndex;
          bailOutInfo = (BailOutInfo *)(__startIndex->data).word;
          _unit.word._4_4_ =
               BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&bailOutInfo);
          while (_unit.word._4_4_ != 0xffffffff) {
            uVar8 = (Type)_unit.word + _unit.word._4_4_;
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&bailOutInfo,_unit.word._4_4_);
            form = L", s%d";
            if (bVar2) {
              form = L"s%d";
            }
            Output::Print(form,(ulong)uVar8);
            bVar2 = false;
            _unit.word._4_4_ =
                 BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&bailOutInfo);
          }
          if (__startIndex == (Type_conflict)0x0) break;
        }
      }
      lVar11._0_1_ = this[1].m_noLazyHelperAssert;
      lVar11._1_3_ = *(undefined3 *)&this[1].field_0x9;
      lVar11._4_4_ = this[1].bailOutByteCodeLocation;
      if (lVar11 != 0) {
        Output::Print(L"  PropSym: %d",
                      (ulong)*(uint *)(*(long *)&this[1].m_noLazyHelperAssert + 0x10));
      }
    }
  }
  if (((PrintOpCodeName.this._3_1_ & 1) == 0) && ((PrintOpCodeName.this._1_1_ & 1) == 0)) {
    DumpByteCodeOffset(this);
  }
  if (((PrintOpCodeName.this._2_1_ & 1) == 0) &&
     ((bVar2 = HasBailOutInfo(this), bVar2 || (bVar2 = HasAuxBailOut(this), bVar2)))) {
    register0x00000000 = GetBailOutInfo(this);
    Output::SkipToColumn(0x55);
    if ((PrintOpCodeName.this._3_1_ & 1) == 0) {
      Output::Print(L"Bailout: #%04x",(ulong)stack0xffffffffffffff50->bailOutOffset);
    }
    bVar2 = Func::IsTopFunc(stack0xffffffffffffff50->bailOutFunc);
    if (!bVar2) {
      pcVar20 = Func::GetDebugNumberSet
                          (stack0xffffffffffffff50->bailOutFunc,(wchar (*) [42])local_108);
      Output::Print(L" Func %s",pcVar20);
    }
    pcVar21 = GetBailOutKindName(this);
    Output::Print(L" (%S)",pcVar21);
  }
  if ((PrintOpCodeName.this._4_4_ & IRDumpFlags_SkipEndLine) == IRDumpFlags_None) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
Instr::Dump(IRDumpFlags flags)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    bool const SkipByteCodeOffset = !!(flags & IRDumpFlags_SkipByteCodeOffset);

    const auto PrintOpCodeName = [&]() {
        Output::SkipToColumn(23);
#if DBG
        WORD oldValue = 0;
        if (this->highlight != 0)
        {
            oldValue = Output::SetConsoleForeground(this->highlight);
        }
#endif
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(m_opcode));
#if DBG
        if (this->highlight != 0)
        {
            Output::SetConsoleForeground(oldValue);
        }
#endif
        Output::SkipToColumn(38);
    };

    // forward decl before goto statement
    Opnd * dst = nullptr;

    if(m_opcode == Js::OpCode::BoundCheck || m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        PrintOpCodeName();

        // src1 <= src2 + dst

        Assert(GetSrc1());
        if(GetSrc1()->IsIntConstOpnd())
        {
            Output::Print(_u("%d"), GetSrc1()->AsIntConstOpnd()->GetValue());
        }
        else
        {
            GetSrc1()->Dump(flags, m_func);
        }

        bool useLessThanOrEqual = true;
        bool usePlus = true;
        bool dumpSrc2 = false;
        int32 offset = GetDst() ? GetDst()->AsIntConstOpnd()->AsInt32() : 0;
        if(GetSrc2())
        {
            if(GetSrc2()->IsIntConstOpnd())
            {
            #if DBG
                int32 temp;
                Assert(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp));
            #endif
                offset += GetSrc2()->AsIntConstOpnd()->AsInt32();
            }
            else
            {
                dumpSrc2 = true;
                if(offset == -1)
                {
                    useLessThanOrEqual = false; // < instead of <=
                    offset = 0;
                }
                else if(offset < 0 && offset != IntConstMin)
                {
                    usePlus = false;
                    offset = -offset;
                }
            }
        }

        Output::Print(_u(" %S "), useLessThanOrEqual ? "<=" : "<");
        if(dumpSrc2)
        {
            GetSrc2()->Dump(flags, m_func);
        }
        if(offset != 0)
        {
            if(dumpSrc2)
            {
                Output::Print(_u(" %C "), usePlus ? '+' : '-');
            }
            Output::Print(_u("%d"), offset);
        }

        goto PrintByteCodeOffsetEtc;
    }

    Output::SkipToColumn(4);

    dst = this->GetDst();

    if (dst)
    {
        dst->Dump(flags, this->m_func);

        bool const dumpMarkTemp = PHASE_DUMP(Js::MarkTempPhase, m_func)
            || PHASE_TRACE(Js::MarkTempPhase, m_func);
        bool const dumpMarkTempNumber = dumpMarkTemp || PHASE_DUMP(Js::MarkTempNumberPhase, m_func)
            || PHASE_TRACE(Js::MarkTempNumberPhase, m_func);
        bool const dumpMarkTempObject = dumpMarkTemp || PHASE_DUMP(Js::MarkTempObjectPhase, m_func)
            || PHASE_TRACE(Js::MarkTempObjectPhase, m_func);

        if ((dumpMarkTempNumber && (this->dstIsTempNumberTransferred || this->dstIsTempNumber))
            || (dumpMarkTempObject && this->dstIsTempObject))
        {
            Output::Print(_u("["));

            if (dumpMarkTempNumber)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempNumberProducing(this->m_opcode))
                {
                    if (this->dstIsTempNumberTransferred)
                    {
                        Assert(this->dstIsTempNumber);
                        Output::Print(_u("x"));
                    }
                    else if (this->dstIsTempNumber)
                    {
                        Output::Print(_u("#"));
                    }
                }
            }
            if (dumpMarkTempObject)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempObjectProducing(this->m_opcode))
                {
                    if (this->dstIsTempObject)
                    {
                        Output::Print(_u("o"));
                    }
                }
            }

            Output::Print(_u("tmp]"));
        }
        if(PHASE_DUMP(Js::TrackNegativeZeroPhase, m_func->GetTopFunc()) && !ShouldCheckForNegativeZero())
        {
            Output::Print(_u("[-0]"));
        }
        if (PHASE_DUMP(Js::TypedArrayVirtualPhase, m_func->GetTopFunc()) && (!IsDstNotAlwaysConvertedToInt32() || !IsDstNotAlwaysConvertedToNumber()))
        {
            if (!IsDstNotAlwaysConvertedToInt32())
                Output::Print(_u("[->i]"));
            else
                Output::Print(_u("[->n]"));

        }
        if(PHASE_DUMP(Js::TrackIntOverflowPhase, m_func->GetTopFunc()))
        {
            // ignoring 32-bit overflow ?
            if(!ShouldCheckFor32BitOverflow())
            {
                // ignoring 32-bits or more ?
                if(ShouldCheckForNon32BitOverflow())
                    Output::Print(_u("[OF %d]"), ignoreOverflowBitCount);
                else
                    Output::Print(_u("[OF]"));
            }
        }

        if (this->isSafeToSpeculate)
        {
            Output::SkipToColumn(19);
            Output::Print(_u("<=="));
        }
        else
        {
            Output::SkipToColumn(20);
            Output::Print(_u("="));
        }
    }

    PrintOpCodeName();

    if (this->IsBranchInstr())
    {
        BranchInstr * branchInstr = this->AsBranchInstr();
        LabelInstr * targetInstr = branchInstr->GetTarget();
        bool labelPrinted = true;
        if (targetInstr == NULL)
        {
            // Checking the 'm_isMultiBranch' field here directly as well to bypass asserting when tracing IR builder
            if(branchInstr->m_isMultiBranch && branchInstr->IsMultiBranch())
            {
                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                // If this MultiBranchInstr has been lowered to a machine instruction, which means
                // its opcode is not Js::OpCode::MultiBr, there is no need to print the labels.
                if (this->m_opcode == Js::OpCode::MultiBr)
                {
                    multiBranchInstr->MapMultiBrLabels([](IR::LabelInstr * labelInstr) -> void
                    {
                        Output::Print(_u("$L%d "), labelInstr->m_id);
                    });
                }
                else
                {
                    labelPrinted = false;
                }
            }
            else
            {
                Output::Print(_u("??"));
            }
        }
        else
        {
            Output::Print(_u("$L%d"), targetInstr->m_id);
        }
        if (this->GetSrc1() && labelPrinted)
        {
            Output::Print(_u(", "));
        }
    }
    else if (this->IsPragmaInstr() && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Output::Print(_u("#%d"), this->AsPragmaInstr()->m_statementIndex);
    }

    // scope
    {
        Opnd * src1 = this->GetSrc1();
        if (this->m_opcode == Js::OpCode::NewScFunc || this->m_opcode == Js::OpCode::NewScGenFunc)
        {
            Assert(src1->IsIntConstOpnd());
            Js::ParseableFunctionInfo * function = nullptr;
            if (!m_func->IsOOPJIT())
            {
                function = ((Js::ParseableFunctionInfo *)m_func->GetJITFunctionBody()->GetAddr())->GetNestedFunctionForExecution((uint)src1->AsIntConstOpnd()->GetValue())->GetParseableFunctionInfo();
            }
            Output::Print(_u("func:%s()"), function ? function->GetDisplayName() : _u("???"));
            Output::Print(_u(", env:"));
            this->GetSrc2()->AsRegOpnd()->m_sym->Dump(flags);
        }
        else if (src1)
        {
            src1->Dump(flags, this->m_func);
            Opnd * src2 = this->GetSrc2();
            if (src2)
            {
                Output::Print(_u(", "));
                src2->Dump(flags, this->m_func);
            }
        }
    }

    if (this->IsByteCodeUsesInstr() || this->m_opcode == Js::OpCode::SpeculatedLoadFence)
    {
        ByteCodeUsesInstr* tempbcu = static_cast<ByteCodeUsesInstr*>(this);
        if (tempbcu->GetByteCodeUpwardExposedUsed())
        {
            bool first = true;
            FOREACH_BITSET_IN_SPARSEBV(id, tempbcu->GetByteCodeUpwardExposedUsed())
            {
                Output::Print(first? _u("s%d") : _u(", s%d"), id);
                first = false;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        if (tempbcu->propertySymUse)
        {
            Output::Print(_u("  PropSym: %d"), tempbcu->propertySymUse->m_id);
        }
    }

PrintByteCodeOffsetEtc:
    if (!AsmDumpMode && !SkipByteCodeOffset)
    {
        this->DumpByteCodeOffset();
    }

    if (!SimpleForm)
    {
        if (this->HasBailOutInfo() || this->HasAuxBailOut())
        {
            BailOutInfo * bailOutInfo = this->GetBailOutInfo();
            Output::SkipToColumn(85);
            if (!AsmDumpMode)
            {
                Output::Print(_u("Bailout: #%04x"), bailOutInfo->bailOutOffset);
            }
            if (!bailOutInfo->bailOutFunc->IsTopFunc())
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u(" Func %s"), bailOutInfo->bailOutFunc->GetDebugNumberSet(debugStringBuffer));
            }
            Output::Print(_u(" (%S)"), this->GetBailOutKindName());
        }
    }
    if ((flags & IRDumpFlags_SkipEndLine) == 0)
    {
        Output::Print(_u("\n"));
    }
}